

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O1

RefCntAutoPtr<Diligent::BasicFileStream> * __thiscall
Diligent::RefCntAutoPtr<Diligent::BasicFileStream>::operator=
          (RefCntAutoPtr<Diligent::BasicFileStream> *this,
          RefCntAutoPtr<Diligent::BasicFileStream> *AutoPtr)

{
  BasicFileStream *pBVar1;
  BasicFileStream *pObj;
  
  pBVar1 = AutoPtr->m_pObject;
  if (this->m_pObject != pBVar1) {
    AutoPtr->m_pObject = (BasicFileStream *)0x0;
    if (this->m_pObject != (BasicFileStream *)0x0) {
      (*(this->m_pObject->super_ObjectBase<Diligent::IFileStream>).
        super_RefCountedObject<Diligent::IFileStream>.super_IFileStream.super_IObject._vptr_IObject
        [2])();
      this->m_pObject = (BasicFileStream *)0x0;
    }
    this->m_pObject = pBVar1;
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(RefCntAutoPtr&& AutoPtr) noexcept
    {
        if (m_pObject != AutoPtr.m_pObject)
            Attach(AutoPtr.Detach());

        return *this;
    }